

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O2

int mecab_do(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ModelImpl *this;
  ostream *poVar6;
  undefined4 extraout_var;
  char *pcVar8;
  long *plVar9;
  char *pcVar10;
  long *plVar11;
  int __oflag;
  ulong __n;
  uint uVar12;
  ostream_wrapper ofs;
  istream_wrapper ifs;
  scoped_fixed_array<char,_8192> line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rest;
  string sentence;
  scoped_array<char> ibuf_data;
  string ofilename;
  Param param;
  undefined8 *puVar7;
  undefined4 extraout_var_00;
  
  MeCab::Param::Param(&param);
  iVar2 = MeCab::Param::open(&param,argc,(int)argv,MeCab::(anonymous_namespace)::long_options);
  if ((char)iVar2 == '\0') {
    pcVar8 = MeCab::whatlog::str(&param.what_);
    poVar6 = std::operator<<((ostream *)&std::cout,pcVar8);
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar2 = 1;
    goto LAB_001504a6;
  }
  bVar1 = MeCab::Param::get<bool>(&param,"help");
  if ((!bVar1) &&
     (bVar1 = MeCab::Param::get<bool>(&param,"version"),
     param.help_._M_dataplus = param.version_._M_dataplus, !bVar1)) {
    bVar1 = MeCab::load_dictionary_resource(&param);
    if (bVar1) {
      iVar2 = MeCab::Param::get<int>(&param,"lattice-level");
      if (0 < iVar2) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"lattice-level is DEPERCATED. ");
        poVar6 = std::operator<<(poVar6,"use --marginal or --nbest.");
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      this = (ModelImpl *)operator_new(0x30);
      MeCab::anon_unknown_0::ModelImpl::ModelImpl(this);
      iVar2 = MeCab::anon_unknown_0::ModelImpl::open(this,(char *)&param,__oflag);
      if ((char)iVar2 != '\0') {
        MeCab::Param::get<std::__cxx11::string>(&ofilename,&param,"output");
        if (ofilename._M_string_length == 0) {
          std::__cxx11::string::assign((char *)&ofilename);
        }
        uVar3 = MeCab::Param::get<int>(&param,"nbest");
        if (0xfffffdff < uVar3 - 0x201) {
          MeCab::ostream_wrapper::ostream_wrapper(&ofs,ofilename._M_dataplus._M_p);
          if (((byte)ofs.os_[*(long *)(*(long *)ofs.os_ + -0x18) + 0x20] & 5) == 0) {
            bVar1 = MeCab::Param::get<bool>(&param,"dump-config");
            if (!bVar1) {
              bVar1 = MeCab::Param::get<bool>(&param,"dictionary-info");
              if (!bVar1) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&rest,&param.rest_);
                if (rest.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    rest.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  std::__cxx11::string::string((string *)&sentence,"-",(allocator *)&line);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &rest,&sentence);
                  std::__cxx11::string::~string((string *)&sentence);
                }
                uVar5 = MeCab::Param::get<int>(&param,"input-buffer-size");
                uVar12 = 0x2000;
                if (0x2000 < (int)uVar5) {
                  uVar12 = uVar5;
                }
                if (0x4fffff < (int)uVar12) {
                  uVar12 = 0x500000;
                }
                bVar1 = MeCab::Param::get<bool>(&param,"partial");
                __n = (ulong)uVar12 * 8;
                if (!bVar1) {
                  __n = (ulong)uVar12;
                }
                pcVar8 = (char *)operator_new__(__n);
                ibuf_data._vptr_scoped_array = (_func_int **)&PTR__scoped_array_0019ecc8;
                ibuf_data.ptr_ = pcVar8;
                iVar2 = (*(this->super_Model)._vptr_Model[3])(this);
                plVar9 = (long *)CONCAT44(extraout_var_00,iVar2);
                if (plVar9 != (long *)0x0) {
                  if (rest.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      rest.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
                    MeCab::istream_wrapper::istream_wrapper
                              (&ifs,((rest.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p)
                    ;
                    if (((byte)ifs.is_[*(long *)(*(long *)ifs.is_ + -0x18) + 0x20] & 5) == 0) {
                      do {
                        if (bVar1) {
                          sentence._M_dataplus._M_p = (pointer)&sentence.field_2;
                          sentence._M_string_length = 0;
                          sentence.field_2._M_local_buf[0] = '\0';
                          line._vptr_scoped_fixed_array =
                               (_func_int **)&PTR__scoped_fixed_array_0019ed28;
                          pcVar10 = (char *)operator_new__(0x2000);
                          line.size_ = 0x2000;
                          line.ptr_ = pcVar10;
                          while (plVar11 = (long *)std::istream::getline
                                                             ((char *)ifs.is_,(long)pcVar10),
                                (*(byte *)((long)plVar11 + *(long *)(*plVar11 + -0x18) + 0x20) & 5)
                                == 0) {
                            std::__cxx11::string::append((char *)&sentence);
                            std::__cxx11::string::push_back((char)&sentence);
                            pcVar10 = line.ptr_;
                            iVar2 = strcmp(line.ptr_,"EOS");
                            if ((iVar2 == 0) || (*pcVar10 == '\0')) goto LAB_00150951;
                          }
                          std::ios::clear((int)ifs.is_ +
                                          (int)*(undefined8 *)(*(long *)ifs.is_ + -0x18));
LAB_00150951:
                          strncpy(pcVar8,sentence._M_dataplus._M_p,__n);
                          MeCab::scoped_fixed_array<char,_8192>::~scoped_fixed_array(&line);
                          std::__cxx11::string::~string((string *)&sentence);
                        }
                        else {
                          std::istream::getline((char *)ifs.is_,(long)pcVar8);
                        }
                        if (((*(uint *)(ifs.is_ + *(long *)(*(long *)ifs.is_ + -0x18) + 0x20) & 2)
                             != 0) && (*pcVar8 == '\0')) {
                          iVar2 = 0;
                          goto LAB_00150a52;
                        }
                        if ((*(uint *)(ifs.is_ + *(long *)(*(long *)ifs.is_ + -0x18) + 0x20) & 5) !=
                            0) {
                          poVar6 = std::operator<<((ostream *)&std::cerr,"input-buffer overflow. ");
                          poVar6 = std::operator<<(poVar6,"The line is split. use -b #SIZE option.")
                          ;
                          std::endl<char,std::char_traits<char>>(poVar6);
                          std::ios::clear((int)ifs.is_ +
                                          (int)*(undefined8 *)(*(long *)ifs.is_ + -0x18));
                        }
                        if (uVar3 < 2) {
                          pcVar10 = (char *)(**(code **)(*plVar9 + 8))(plVar9,pcVar8);
                        }
                        else {
                          pcVar10 = (char *)(**(code **)(*plVar9 + 0x18))(plVar9,uVar3,pcVar8);
                        }
                        if (pcVar10 == (char *)0x0) goto LAB_00150a2b;
                        std::operator<<(ofs.os_,pcVar10);
                        std::ostream::flush();
                      } while( true );
                    }
                    poVar6 = std::operator<<((ostream *)&std::cout,"no such file or directory: ");
                    poVar6 = std::operator<<(poVar6,(string *)
                                                    rest.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                    std::endl<char,std::char_traits<char>>(poVar6);
                    goto LAB_00150a4f;
                  }
                  iVar2 = 0;
                  goto LAB_00150a5c;
                }
                poVar6 = std::operator<<((ostream *)&std::cout,"cannot create tagger");
                std::endl<char,std::char_traits<char>>(poVar6);
                iVar2 = 1;
                goto LAB_00150a6a;
              }
              iVar4 = (**(this->super_Model)._vptr_Model)(this);
              iVar2 = 1;
              for (puVar7 = (undefined8 *)CONCAT44(extraout_var,iVar4); puVar7 != (undefined8 *)0x0;
                  puVar7 = (undefined8 *)puVar7[5]) {
                poVar6 = std::operator<<(ofs.os_,"filename:\t");
                poVar6 = std::operator<<(poVar6,(char *)*puVar7);
                std::endl<char,std::char_traits<char>>(poVar6);
                poVar6 = std::operator<<(ofs.os_,"version:\t");
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(ushort *)(puVar7 + 4));
                std::endl<char,std::char_traits<char>>(poVar6);
                poVar6 = std::operator<<(ofs.os_,"charset:\t");
                poVar6 = std::operator<<(poVar6,(char *)puVar7[1]);
                std::endl<char,std::char_traits<char>>(poVar6);
                poVar6 = std::operator<<(ofs.os_,"type:\t");
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(int *)((long)puVar7 + 0x14));
                std::endl<char,std::char_traits<char>>(poVar6);
                poVar6 = std::operator<<(ofs.os_,"size:\t");
                poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
                std::endl<char,std::char_traits<char>>(poVar6);
                poVar6 = std::operator<<(ofs.os_,"left size:\t");
                poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
                std::endl<char,std::char_traits<char>>(poVar6);
                poVar6 = std::operator<<(ofs.os_,"right size:\t");
                poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
                std::endl<char,std::char_traits<char>>(poVar6);
                std::endl<char,std::char_traits<char>>(ofs.os_);
              }
              goto LAB_0015056a;
            }
            MeCab::Param::dump_config(&param,ofs.os_);
          }
          else {
            poVar6 = std::operator<<((ostream *)&std::cout,"no such file or directory: ");
            poVar6 = std::operator<<(poVar6,(string *)&ofilename);
            std::endl<char,std::char_traits<char>>(poVar6);
          }
          iVar2 = 1;
          goto LAB_0015056a;
        }
        poVar6 = std::operator<<((ostream *)&std::cout,"invalid N value");
        std::endl<char,std::char_traits<char>>(poVar6);
        iVar2 = 1;
        goto LAB_00150574;
      }
      pcVar8 = getGlobalError();
      poVar6 = std::operator<<((ostream *)&std::cout,pcVar8);
      std::endl<char,std::char_traits<char>>(poVar6);
      iVar2 = 1;
      goto LAB_00150581;
    }
    param.help_._M_dataplus._M_p = MeCab::whatlog::str(&param.what_);
  }
  poVar6 = std::operator<<((ostream *)&std::cout,param.help_._M_dataplus._M_p);
  iVar2 = 0;
  std::endl<char,std::char_traits<char>>(poVar6);
  goto LAB_001504a6;
LAB_00150a2b:
  pcVar8 = (char *)(**(code **)(*plVar9 + 0xd8))(plVar9);
  poVar6 = std::operator<<((ostream *)&std::cout,pcVar8);
  std::endl<char,std::char_traits<char>>(poVar6);
LAB_00150a4f:
  iVar2 = 1;
LAB_00150a52:
  MeCab::istream_wrapper::~istream_wrapper(&ifs);
LAB_00150a5c:
  (**(code **)(*plVar9 + 0xe8))();
LAB_00150a6a:
  MeCab::scoped_array<char>::~scoped_array(&ibuf_data);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&rest);
LAB_0015056a:
  MeCab::ostream_wrapper::~ostream_wrapper(&ofs);
LAB_00150574:
  std::__cxx11::string::~string((string *)&ofilename);
LAB_00150581:
  (*(this->super_Model)._vptr_Model[7])(this);
LAB_001504a6:
  MeCab::Param::~Param(&param);
  return iVar2;
}

Assistant:

int mecab_do(int argc, char **argv) {
#define WHAT_ERROR(msg) do {                    \
    std::cout << msg << std::endl;              \
    return EXIT_FAILURE; }                      \
  while (0);

  MeCab::Param param;
  if (!param.open(argc, argv, MeCab::long_options)) {
    std::cout << param.what() << std::endl;
    return EXIT_FAILURE;
  }

  if (param.get<bool>("help")) {
    std::cout << param.help() << std::endl;
    return EXIT_SUCCESS;
  }

  if (param.get<bool>("version")) {
    std::cout << param.version() << std::endl;
    return EXIT_SUCCESS;
  }

  if (!load_dictionary_resource(&param)) {
    std::cout << param.what() << std::endl;
    return EXIT_SUCCESS;
  }

  if (param.get<int>("lattice-level") >= 1) {
    std::cerr << "lattice-level is DEPERCATED. "
              << "use --marginal or --nbest." << std::endl;
  }

  MeCab::scoped_ptr<MeCab::ModelImpl> model(new MeCab::ModelImpl);
  if (!model->open(param)) {
    std::cout << MeCab::getLastError() << std::endl;
    return EXIT_FAILURE;
  }

  std::string ofilename = param.get<std::string>("output");
  if (ofilename.empty()) {
    ofilename = "-";
  }

  const int nbest = param.get<int>("nbest");
  if (nbest <= 0 || nbest > NBEST_MAX) {
    WHAT_ERROR("invalid N value");
  }

  MeCab::ostream_wrapper ofs(ofilename.c_str());
  if (!*ofs) {
    WHAT_ERROR("no such file or directory: " << ofilename);
  }

  if (param.get<bool>("dump-config")) {
    param.dump_config(&*ofs);
    return EXIT_FAILURE;
  }

  if (param.get<bool>("dictionary-info")) {
    for (const MeCab::DictionaryInfo *d = model->dictionary_info();
         d; d = d->next) {
      *ofs << "filename:\t" << d->filename << std::endl;
      *ofs << "version:\t" << d->version << std::endl;
      *ofs << "charset:\t" << d->charset << std::endl;
      *ofs << "type:\t" << d->type   << std::endl;
      *ofs << "size:\t" << d->size << std::endl;
      *ofs << "left size:\t" << d->lsize << std::endl;
      *ofs << "right size:\t" << d->rsize << std::endl;
      *ofs << std::endl;
    }
    return EXIT_FAILURE;
  }

  const std::vector<std::string>& rest_ = param.rest_args();
  std::vector<std::string> rest = rest_;

  if (rest.empty()) {
    rest.push_back("-");
  }

  size_t ibufsize = std::min(MAX_INPUT_BUFFER_SIZE,
                             std::max(param.get<int>
                                            ("input-buffer-size"),
                                            MIN_INPUT_BUFFER_SIZE));

  const bool partial = param.get<bool>("partial");
  if (partial) {
    ibufsize *= 8;
  }

  MeCab::scoped_array<char> ibuf_data(new char[ibufsize]);
  char *ibuf = ibuf_data.get();

  MeCab::scoped_ptr<MeCab::Tagger> tagger(model->createTagger());

  if (!tagger.get()) {
    WHAT_ERROR("cannot create tagger");
  }

  for (size_t i = 0; i < rest.size(); ++i) {
    MeCab::istream_wrapper ifs(rest[i].c_str());
    if (!*ifs) {
      WHAT_ERROR("no such file or directory: " << rest[i]);
    }

    while (true) {
      if (!partial) {
        ifs->getline(ibuf, ibufsize);
      } else {
        std::string sentence;
        MeCab::scoped_fixed_array<char, BUF_SIZE> line;
        for (;;) {
          if (!ifs->getline(line.get(), line.size())) {
            ifs->clear(std::ios::eofbit|std::ios::badbit);
            break;
          }
          sentence += line.get();
          sentence += '\n';
          if (std::strcmp(line.get(), "EOS") == 0 || line[0] == '\0') {
            break;
          }
        }
        std::strncpy(ibuf, sentence.c_str(), ibufsize);
      }
      if (ifs->eof() && !ibuf[0]) {
        return false;
      }
      if (ifs->fail()) {
        std::cerr << "input-buffer overflow. "
                  << "The line is split. use -b #SIZE option." << std::endl;
        ifs->clear();
      }
      const char *r = (nbest >= 2) ? tagger->parseNBest(nbest, ibuf) :
          tagger->parse(ibuf);
      if (!r)  {
        WHAT_ERROR(tagger->what());
      }
      *ofs << r << std::flush;
    }
  }

  return EXIT_SUCCESS;

#undef WHAT_ERROR
}